

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acec2Mult.c
# Opt level: O3

void Sdb_StoMergeCuts(Sdb_Sto_t *p,int iObj)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Gia_Man_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Sdb_Cut_t *pSVar5;
  Vec_Mem_t *pVVar6;
  word *pwVar7;
  Vec_Int_t *pVVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  Sdb_Cut_t *pSVar18;
  byte bVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  Sdb_Cut_t *t;
  long lVar24;
  ulong *puVar25;
  bool bVar26;
  uint uVar27;
  Sdb_Cut_t *pSVar28;
  Vec_Int_t *pVVar29;
  uint uVar30;
  word *pwVar31;
  ulong *puVar32;
  int *piVar33;
  int nSizeC;
  int iVar34;
  uint uVar35;
  int *piVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  ulong uVar41;
  ulong uVar42;
  ulong uVar43;
  Sdb_Cut_t *pSVar44;
  bool bVar45;
  undefined1 auVar46 [16];
  word uTruth [1];
  word uTruth0 [1];
  ulong local_c8;
  int local_bc;
  ulong local_b8;
  ulong local_b0;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  undefined8 local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong *local_70;
  long local_68;
  ulong local_60;
  word local_58;
  int *local_50;
  Sdb_Cut_t *local_48;
  ulong local_40;
  ulong local_38;
  
  if ((iObj < 0) || (p->pGia->nObjs <= iObj)) {
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar2 = p->pGia->pObjs;
  uVar43 = (ulong)(uint)iObj;
  local_90 = *(ulong *)(pGVar2 + uVar43);
  uVar20 = (uint)local_90;
  bVar45 = (~uVar20 & 0x1fffffff) != 0;
  uVar10 = uVar20 & 0x1fffffff;
  uVar21 = (uint)(local_90 >> 0x20) & 0x1fffffff;
  local_b8 = (ulong)(uint)p->nCutSize;
  local_80 = (ulong)(uint)p->nCutNum;
  local_bc = iObj;
  local_78 = uVar43;
  local_a4 = Sdb_StoPrepareSet(p,iObj - uVar10,0);
  iVar11 = Sdb_StoPrepareSet(p,iObj - uVar21,1);
  auVar9 = _DAT_0094e250;
  uVar22 = (uint)*(undefined8 *)(pGVar2 + uVar43);
  if (((-1 < (int)uVar22) && (uVar22 = uVar22 & 0x1fffffff, uVar22 != 0x1fffffff)) &&
     (uVar22 == ((uint)((ulong)*(undefined8 *)(pGVar2 + uVar43) >> 0x20) & 0x1fffffff))) {
    __assert_fail("!Gia_ObjIsBuf(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                  ,0x2e4,"void Sdb_StoMergeCuts(Sdb_Sto_t *, int)");
  }
  pGVar2 = pGVar2 + uVar43;
  pGVar3 = p->pGia;
  pGVar4 = pGVar3->pObjs;
  if ((pGVar2 < pGVar4) || (pGVar4 + pGVar3->nObjs <= pGVar2)) {
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  if ((pGVar3->pMuxes != (uint *)0x0) &&
     (pGVar3->pMuxes[(int)((ulong)((long)pGVar2 - (long)pGVar4) >> 2) * -0x55555555] != 0)) {
    __assert_fail("!Gia_ObjIsMux(p->pGia, pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                  ,0x2e5,"void Sdb_StoMergeCuts(Sdb_Sto_t *, int)");
  }
  local_a0 = (uint)(local_90 >> 0x1d) & 1;
  local_90 = (ulong)((uint)(local_90 >> 0x3d) & 1);
  pSVar18 = p->pCuts[2] + 1;
  lVar24 = 0;
  auVar46 = _DAT_0094e240;
  do {
    if (SUB164(auVar46 ^ auVar9,4) == -0x80000000 && SUB164(auVar46 ^ auVar9,0) < -0x7fffffcd) {
      p->ppCuts[lVar24] = pSVar18 + -1;
      p->ppCuts[lVar24 + 1] = pSVar18;
    }
    lVar24 = lVar24 + 2;
    lVar38 = auVar46._8_8_;
    auVar46._0_8_ = auVar46._0_8_ + 2;
    auVar46._8_8_ = lVar38 + 2;
    pSVar18 = pSVar18 + 2;
  } while (lVar24 != 0x34);
  p->CutCount[0] = (double)(int)(iVar11 * local_a4) + p->CutCount[0];
  if ((int)local_a4 < 1) {
    uVar43 = 0;
    uVar22 = (int)local_80 - 1;
  }
  else {
    pSVar18 = p->pCuts[0];
    local_48 = p->pCuts[1];
    local_9c = (int)local_80 - 1;
    piVar33 = p->pCuts[0][0].pLeaves;
    local_50 = p->pCuts[1][0].pLeaves;
    uVar16 = 0;
    uVar43 = 0;
    uVar17 = local_b8;
    do {
      local_40 = uVar16;
      if (0 < iVar11) {
        iVar14 = 0;
        pSVar28 = local_48;
        piVar36 = local_50;
LAB_00689cc7:
        uVar22 = (uint)uVar17;
        if (((int)((*(uint *)&pSVar28->field_0x14 >> 0x1c) + (*(uint *)&pSVar18->field_0x14 >> 0x1c)
                  ) <= (int)uVar22) ||
           (uVar16 = ((Sdb_Cut_t *)&pSVar28->Sign)->Sign | ((Sdb_Cut_t *)&pSVar18->Sign)->Sign,
           uVar16 = uVar16 - (uVar16 >> 1 & 0x5555555555555555),
           uVar16 = (uVar16 >> 2 & 0x3333333333333333) + (uVar16 & 0x3333333333333333),
           (int)(uint)(byte)(((uVar16 >> 4) + uVar16 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                            0x38) <= (int)uVar22)) {
          p->CutCount[1] = p->CutCount[1] + 1.0;
          lVar24 = (long)(int)uVar43;
          pSVar44 = p->ppCuts[lVar24];
          uVar15 = *(uint *)&pSVar18->field_0x14;
          uVar27 = uVar15 >> 0x1c;
          uVar23 = *(uint *)&pSVar28->field_0x14 >> 0x1c;
          if ((uVar27 == uVar22) && (uVar23 == uVar22)) {
            uVar35 = uVar22;
            if (0xfffffff < uVar15) {
              uVar16 = 0;
              do {
                if (piVar33[uVar16] != piVar36[uVar16]) goto LAB_0068aa42;
                pSVar44->pLeaves[uVar16] = piVar33[uVar16];
                uVar16 = uVar16 + 1;
              } while (uVar17 != uVar16);
            }
LAB_00689e7e:
            *(uint *)&pSVar44->field_0x14 =
                 *(uint *)&pSVar44->field_0x14 & 0xfffffff | uVar35 << 0x1c;
            pSVar44->iFunc = -1;
            pSVar44->Sign =
                 ((Sdb_Cut_t *)&pSVar28->Sign)->Sign | ((Sdb_Cut_t *)&pSVar18->Sign)->Sign;
            if ((int)uVar43 < 1) {
              pSVar44 = p->ppCuts[lVar24];
            }
            else {
              pSVar44 = p->ppCuts[uVar43];
              uVar22 = *(uint *)&pSVar44->field_0x14 >> 0x1c;
              uVar16 = 0;
              do {
                pSVar5 = p->ppCuts[uVar16];
                uVar15 = *(uint *)&pSVar5->field_0x14 >> 0x1c;
                if ((uVar15 <= uVar22) && ((pSVar5->Sign & ~pSVar44->Sign) == 0)) {
                  uVar17 = local_b8;
                  if (uVar22 == uVar15) {
                    if (*(uint *)&pSVar44->field_0x14 < 0x10000000) goto LAB_0068aa42;
                    uVar37 = 0;
                    while (pSVar44->pLeaves[uVar37] == pSVar5->pLeaves[uVar37]) {
                      uVar37 = uVar37 + 1;
                      if (uVar22 == uVar37) goto LAB_0068aa42;
                    }
                  }
                  else {
                    if (uVar22 <= uVar15) {
                      __assert_fail("nSizeB > nSizeC",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                                    ,0x1ec,
                                    "int Sdb_CutSetCutIsContainedOrder(Sdb_Cut_t *, Sdb_Cut_t *)");
                    }
                    if (*(uint *)&pSVar5->field_0x14 < 0x10000000) goto LAB_0068aa42;
                    uVar37 = 0;
                    uVar23 = 0;
                    do {
                      if (pSVar5->pLeaves[(int)uVar23] < pSVar44->pLeaves[uVar37]) break;
                      if ((pSVar44->pLeaves[uVar37] == pSVar5->pLeaves[(int)uVar23]) &&
                         (uVar23 = uVar23 + 1, uVar23 == uVar15)) goto LAB_0068aa42;
                      uVar37 = uVar37 + 1;
                    } while (uVar22 != uVar37);
                  }
                }
                uVar16 = uVar16 + 1;
              } while (uVar16 != uVar43);
            }
            p->CutCount[2] = p->CutCount[2] + 1.0;
            if (p->fCutMin != 0) {
              uVar22 = p->nCutSize;
              local_b0 = uVar43;
              local_68 = lVar24;
              if ((int)uVar22 < 7) {
                uVar22 = pSVar18->iFunc;
                if ((int)uVar22 < 0) {
LAB_0068adad:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12f,"int Abc_Lit2Var(int)");
                }
                pVVar6 = p->vTtMem;
                uVar15 = uVar22 >> 1;
                if (pVVar6->nEntries <= (int)uVar15) {
LAB_0068adcc:
                  __assert_fail("i >= 0 && i < p->nEntries",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                                ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
                }
                bVar19 = (byte)pVVar6->LogPageSze;
                uVar23 = pSVar28->iFunc;
                if ((int)uVar23 < 0) goto LAB_0068adad;
                uVar27 = uVar23 >> 1;
                if ((uint)pVVar6->nEntries <= uVar27) goto LAB_0068adcc;
                uVar35 = *(uint *)&pSVar44->field_0x14;
                uVar30 = uVar35 >> 0x1c;
                uVar17 = (ulong)uVar30;
                uVar16 = -(ulong)((uVar22 & 1) != local_a0) ^
                         pVVar6->ppPages[uVar15 >> (bVar19 & 0x1f)]
                         [(int)((uVar15 & pVVar6->PageMask) * pVVar6->nEntrySize)];
                uVar37 = -(ulong)((uVar23 & 1) != (uint)local_90) ^
                         pVVar6->ppPages[uVar27 >> (bVar19 & 0x1f)]
                         [(int)((uVar27 & pVVar6->PageMask) * pVVar6->nEntrySize)];
                uVar22 = (*(uint *)&pSVar18->field_0x14 >> 0x1c) - 1;
                if (0xfffffff < *(uint *)&pSVar18->field_0x14 && 0xfffffff < uVar35) {
                  lVar38 = uVar17 * 0x18 + 0xa2b838;
                  uVar39 = uVar17;
                  do {
                    uVar42 = uVar39 - 1;
                    uVar41 = (ulong)uVar22;
                    if (pSVar44->pLeaves[uVar39 - 1] <= pSVar18->pLeaves[uVar41]) {
                      if (pSVar44->pLeaves[uVar39 - 1] != pSVar18->pLeaves[uVar41])
                      goto LAB_0068ad6f;
                      if (uVar41 < uVar42) {
                        bVar19 = (char)(-1 << ((byte)uVar22 & 0x1f)) +
                                 (char)(1 << ((byte)uVar42 & 0x1f));
                        lVar40 = uVar41 * 0x90;
                        uVar16 = (uVar16 & *(ulong *)(lVar38 + lVar40)) >> (bVar19 & 0x3f) |
                                 (*(ulong *)(lVar38 + -8 + lVar40) & uVar16) << (bVar19 & 0x3f) |
                                 *(ulong *)(lVar38 + -0x10 + lVar40) & uVar16;
                      }
                      uVar22 = uVar22 - 1;
                    }
                  } while ((1 < uVar39) &&
                          (lVar38 = lVar38 + -0x18, uVar39 = uVar42, -1 < (int)uVar22));
                }
                if (uVar22 != 0xffffffff) {
LAB_0068ae29:
                  __assert_fail("k == -1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                ,0x732,"word Abc_Tt6Expand(word, int *, int, int *, int)");
                }
                uVar22 = (*(uint *)&pSVar28->field_0x14 >> 0x1c) - 1;
                if (0xfffffff < *(uint *)&pSVar28->field_0x14 && 0xfffffff < uVar35) {
                  lVar38 = uVar17 * 0x18 + 0xa2b838;
                  uVar39 = uVar17;
                  do {
                    uVar42 = uVar39 - 1;
                    uVar41 = (ulong)uVar22;
                    if (pSVar44->pLeaves[uVar39 - 1] <= pSVar28->pLeaves[uVar41]) {
                      if (pSVar44->pLeaves[uVar39 - 1] != pSVar28->pLeaves[uVar41]) {
LAB_0068ad6f:
                        __assert_fail("pCut[i] == pCut0[k]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                      ,0x72d,"word Abc_Tt6Expand(word, int *, int, int *, int)");
                      }
                      if (uVar41 < uVar42) {
                        bVar19 = (char)(-1 << ((byte)uVar22 & 0x1f)) +
                                 (char)(1 << ((byte)uVar42 & 0x1f));
                        lVar40 = uVar41 * 0x90;
                        uVar37 = (uVar37 & *(ulong *)(lVar38 + lVar40)) >> (bVar19 & 0x3f) |
                                 (*(ulong *)(lVar38 + -8 + lVar40) & uVar37) << (bVar19 & 0x3f) |
                                 *(ulong *)(lVar38 + -0x10 + lVar40) & uVar37;
                      }
                      uVar22 = uVar22 - 1;
                    }
                  } while ((1 < uVar39) &&
                          (lVar38 = lVar38 + -0x18, uVar39 = uVar42, -1 < (int)uVar22));
                }
                if (uVar22 != 0xffffffff) goto LAB_0068ae29;
                local_c8 = uVar37 & uVar16;
                if ((-1 < (int)uVar20 && bVar45) && uVar10 < uVar21) {
                  local_c8 = uVar37 ^ uVar16;
                }
                uVar22 = (uint)local_c8 & 1;
                uVar16 = (ulong)uVar22;
                local_c8 = -uVar16 ^ local_c8;
                if (p->fTruthMin != 0) {
                  uVar15 = 0;
                  uVar37 = local_c8;
                  if (0xfffffff < uVar35) {
                    uVar39 = 0;
                    lVar38 = 0xa2b848;
                    pwVar31 = s_Truths6Neg;
                    uVar15 = 0;
                    do {
                      bVar19 = (byte)(1 << ((byte)uVar39 & 0x1f));
                      if ((*pwVar31 & (uVar37 >> (bVar19 & 0x3f) ^ uVar37)) != 0) {
                        lVar40 = (long)(int)uVar15;
                        if (lVar40 < (long)uVar39) {
                          pSVar44->pLeaves[lVar40] = pSVar44->pLeaves[uVar39];
                          bVar19 = (char)(-1 << ((byte)uVar15 & 0x1f)) + bVar19;
                          lVar40 = lVar40 * 0x90;
                          uVar37 = (uVar37 & *(ulong *)(lVar38 + 8 + lVar40)) >> (bVar19 & 0x3f) |
                                   (*(ulong *)(lVar38 + lVar40) & uVar37) << (bVar19 & 0x3f) |
                                   *(ulong *)(lVar38 + -8 + lVar40) & uVar37;
                        }
                        uVar15 = uVar15 + 1;
                      }
                      uVar39 = uVar39 + 1;
                      pwVar31 = pwVar31 + 1;
                      lVar38 = lVar38 + 0x18;
                    } while (uVar17 != uVar39);
                  }
                  uVar17 = local_c8;
                  local_88 = uVar16;
                  if ((uVar15 != uVar30) && (uVar17 = uVar37, (int)uVar30 <= (int)uVar15)) {
                    __assert_fail("k < nVars",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                  ,0x754,"int Abc_Tt6MinBase(word *, int *, int)");
                  }
                  *(uint *)&pSVar44->field_0x14 =
                       *(uint *)&pSVar44->field_0x14 & 0xfffffff | uVar15 << 0x1c;
                  local_c8 = uVar17;
                }
                if ((local_c8 & 1) != 0) {
                  __assert_fail("(int)(t & 1) == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                                ,0x256,
                                "int Sdb_CutComputeTruth6(Sdb_Sto_t *, Sdb_Cut_t *, Sdb_Cut_t *, int, int, Sdb_Cut_t *, int)"
                               );
                }
                iVar13 = Vec_MemHashInsert(p->vTtMem,&local_c8);
                if (iVar13 < 0) goto LAB_0068ae48;
                pSVar44->iFunc = uVar22 + iVar13 * 2;
                uVar22 = *(uint *)&pSVar44->field_0x14 >> 0x1c;
                if (uVar30 < uVar22) {
                  __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                                ,0x259,
                                "int Sdb_CutComputeTruth6(Sdb_Sto_t *, Sdb_Cut_t *, Sdb_Cut_t *, int, int, Sdb_Cut_t *, int)"
                               );
                }
                pSVar44 = p->ppCuts[lVar24];
                if (uVar30 <= uVar22) goto LAB_0068a83a;
              }
              else {
                iVar13 = uVar22 - 6;
                uVar23 = 1 << ((byte)iVar13 & 0x1f);
                uVar15 = pSVar18->iFunc;
                if ((int)uVar15 < 0) goto LAB_0068adad;
                pVVar6 = p->vTtMem;
                uVar27 = uVar15 >> 1;
                if (pVVar6->nEntries <= (int)uVar27) goto LAB_0068adcc;
                bVar19 = (byte)pVVar6->LogPageSze;
                uVar35 = pSVar28->iFunc;
                if ((int)uVar35 < 0) goto LAB_0068adad;
                local_88 = (ulong)uVar22;
                uVar30 = uVar35 >> 1;
                if ((uint)pVVar6->nEntries <= uVar30) goto LAB_0068adcc;
                iVar12 = (uVar27 & pVVar6->PageMask) * pVVar6->nEntrySize;
                pwVar31 = pVVar6->ppPages[uVar27 >> (bVar19 & 0x1f)];
                iVar34 = (uVar30 & pVVar6->PageMask) * pVVar6->nEntrySize;
                pwVar7 = pVVar6->ppPages[uVar30 >> (bVar19 & 0x1f)];
                if ((uVar15 & 1) == local_a0) {
                  if (iVar13 != 0x1f) {
                    uVar43 = 0;
                    do {
                      local_58 = pwVar31[(long)iVar12 + uVar43];
                      uVar43 = uVar43 + 1;
                    } while (uVar23 != uVar43);
                  }
                }
                else if (iVar13 != 0x1f) {
                  uVar43 = 0;
                  do {
                    local_58 = ~pwVar31[(long)iVar12 + uVar43];
                    uVar43 = uVar43 + 1;
                  } while (uVar23 != uVar43);
                }
                if ((uVar35 & 1) == (uint)local_90) {
                  if (iVar13 != 0x1f) {
                    uVar43 = 0;
                    do {
                      local_60 = pwVar7[(long)iVar34 + uVar43];
                      uVar43 = uVar43 + 1;
                    } while (uVar23 != uVar43);
                  }
                }
                else if (iVar13 != 0x1f) {
                  uVar43 = 0;
                  do {
                    local_60 = ~pwVar7[(long)iVar34 + uVar43];
                    uVar43 = uVar43 + 1;
                  } while (uVar23 != uVar43);
                }
                local_70 = (ulong *)CONCAT44(local_70._4_4_,uVar23);
                uVar43 = (ulong)(*(uint *)&pSVar44->field_0x14 >> 0x1c);
                uVar15 = (*(uint *)&pSVar18->field_0x14 >> 0x1c) - 1;
                local_38 = uVar43;
                if (0xfffffff < *(uint *)&pSVar18->field_0x14 &&
                    0xfffffff < *(uint *)&pSVar44->field_0x14) {
                  do {
                    uVar17 = uVar43 - 1;
                    if (pSVar44->pLeaves[uVar43 - 1] <= pSVar18->pLeaves[uVar15]) {
                      if (pSVar44->pLeaves[uVar43 - 1] != pSVar18->pLeaves[uVar15])
                      goto LAB_0068ad8e;
                      if (uVar15 < uVar17) {
                        Abc_TtSwapVars(&local_58,uVar22,uVar15,(int)uVar17);
                      }
                      uVar15 = uVar15 - 1;
                    }
                  } while ((1 < uVar43) && (uVar43 = uVar17, -1 < (int)uVar15));
                }
                if (uVar15 != 0xffffffff) {
LAB_0068ae67:
                  __assert_fail("k == -1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                ,0x741,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
                }
                uVar15 = (*(uint *)&pSVar28->field_0x14 >> 0x1c) - 1;
                if ((0xfffffff < *(uint *)&pSVar28->field_0x14) &&
                   (0xfffffff < *(uint *)&pSVar44->field_0x14)) {
                  uVar43 = (ulong)(*(uint *)&pSVar44->field_0x14 >> 0x1c);
                  do {
                    uVar17 = uVar43 - 1;
                    if (pSVar44->pLeaves[uVar43 - 1] <= pSVar28->pLeaves[uVar15]) {
                      if (pSVar44->pLeaves[uVar43 - 1] != pSVar28->pLeaves[uVar15]) {
LAB_0068ad8e:
                        __assert_fail("pCut[i] == pCut0[k]",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                      ,0x73c,
                                      "void Abc_TtExpand(word *, int, int *, int, int *, int)");
                      }
                      if (uVar15 < uVar17) {
                        Abc_TtSwapVars(&local_60,uVar22,uVar15,(int)uVar17);
                      }
                      uVar15 = uVar15 - 1;
                    }
                  } while ((1 < uVar43) && (uVar43 = uVar17, -1 < (int)uVar15));
                }
                if (uVar15 != 0xffffffff) goto LAB_0068ae67;
                if ((-1 < (int)uVar20 && bVar45) && uVar10 < uVar21) {
                  uVar17 = local_60 ^ local_58;
                }
                else {
                  uVar17 = local_60 & local_58;
                }
                if ((uVar17 & 1) == 0) {
                  local_98 = 0;
                  if (iVar13 != 0x1f) {
LAB_0068a67f:
                    local_c8 = uVar17;
                  }
                }
                else {
                  local_98 = 1;
                  if (iVar13 != 0x1f) {
                    uVar17 = ~uVar17;
                    goto LAB_0068a67f;
                  }
                }
                if (p->fTruthMin != 0) {
                  uVar15 = *(uint *)&pSVar44->field_0x14;
                  uVar23 = uVar15 >> 0x1c;
                  if ((int)uVar22 < (int)uVar23) {
                    __assert_fail("nVars <= nVarsAll",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                  ,0x75b,"int Abc_TtMinBase(word *, int *, int, int)");
                  }
                  uVar22 = 0;
                  if (0xfffffff < uVar15) {
                    local_70 = &local_c8 + (int)local_70;
                    uVar43 = 0;
                    iVar12 = 0;
                    do {
                      if (uVar43 < 6) {
                        if ((iVar13 != 0x1f) &&
                           ((s_Truths6Neg[uVar43] &
                            (local_c8 >> ((byte)(1 << ((byte)uVar43 & 0x1f)) & 0x3f) ^ local_c8)) !=
                            0)) {
LAB_0068a704:
                          if ((long)iVar12 < (long)uVar43) {
                            pSVar44->pLeaves[iVar12] = pSVar44->pLeaves[uVar43];
                            Abc_TtSwapVars(&local_c8,(int)local_88,iVar12,(int)uVar43);
                          }
                          iVar12 = iVar12 + 1;
                        }
                      }
                      else if (iVar13 != 0x1f) {
                        bVar19 = (byte)uVar43 - 6;
                        uVar17 = (ulong)(uint)(1 << (bVar19 & 0x1f));
                        uVar22 = 2 << (bVar19 & 0x1f);
                        puVar25 = &local_c8 + uVar17;
                        puVar32 = &local_c8;
                        do {
                          uVar16 = 0;
                          do {
                            if (puVar32[uVar16] != puVar25[uVar16]) goto LAB_0068a704;
                            uVar16 = uVar16 + 1;
                          } while (uVar17 != uVar16);
                          puVar32 = puVar32 + uVar22;
                          puVar25 = puVar25 + uVar22;
                        } while (puVar32 < local_70);
                      }
                      uVar43 = uVar43 + 1;
                    } while (uVar43 != uVar23);
                    if ((int)uVar23 < iVar12) {
                      __assert_fail("k < nVars",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                                    ,0x769,"int Abc_TtMinBase(word *, int *, int, int)");
                    }
                    uVar15 = *(uint *)&pSVar44->field_0x14;
                    uVar22 = iVar12 << 0x1c;
                    uVar17 = local_c8;
                  }
                  *(uint *)&pSVar44->field_0x14 = uVar15 & 0xfffffff | uVar22;
                }
                lVar24 = local_68;
                uVar43 = local_b0;
                if ((uVar17 & 1) != 0) {
                  __assert_fail("(uTruth[0] & 1) == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                                ,0x271,
                                "int Sdb_CutComputeTruth(Sdb_Sto_t *, Sdb_Cut_t *, Sdb_Cut_t *, int, int, Sdb_Cut_t *, int)"
                               );
                }
                iVar13 = Vec_MemHashInsert(p->vTtMem,&local_c8);
                if (iVar13 < 0) {
LAB_0068ae48:
                  __assert_fail("Var >= 0 && !(c >> 1)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                                ,0x12e,"int Abc_Var2Lit(int, int)");
                }
                pSVar44->iFunc = (int)local_98 + iVar13 * 2;
                uVar22 = *(uint *)&pSVar44->field_0x14 >> 0x1c;
                if ((uint)local_38 < uVar22) {
                  __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                                ,0x275,
                                "int Sdb_CutComputeTruth(Sdb_Sto_t *, Sdb_Cut_t *, Sdb_Cut_t *, int, int, Sdb_Cut_t *, int)"
                               );
                }
                pSVar44 = p->ppCuts[lVar24];
                if ((uint)local_38 <= uVar22) goto LAB_0068a83a;
              }
              if (*(uint *)&pSVar44->field_0x14 < 0x10000000) {
                uVar17 = 0;
              }
              else {
                uVar16 = 0;
                uVar17 = 0;
                do {
                  uVar17 = uVar17 | 1L << ((ulong)(byte)pSVar44->pLeaves[uVar16] & 0x3f);
                  uVar16 = uVar16 + 1;
                } while (*(uint *)&pSVar44->field_0x14 >> 0x1c != uVar16);
              }
              pSVar44->Sign = uVar17;
            }
LAB_0068a83a:
            uVar15 = (uint)uVar43;
            uVar22 = *(uint *)&pSVar44->field_0x14;
            uVar23 = 0;
            if (0xfffffff < uVar22) {
              uVar17 = 0;
              uVar23 = 0;
              do {
                iVar13 = pSVar44->pLeaves[uVar17];
                if (((long)iVar13 < 0) || (p->vRefs->nSize <= iVar13)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                uVar23 = uVar23 + (p->vRefs->pArray[iVar13] == 1);
                uVar17 = uVar17 + 1;
              } while (uVar22 >> 0x1c != uVar17);
              uVar23 = uVar23 & 0xfffffff;
            }
            *(uint *)&pSVar44->field_0x14 = uVar22 & 0xf0000000 | uVar23;
            uVar17 = local_b8;
            if (uVar15 != 0) {
              if (0 < (int)uVar15) {
                uVar43 = uVar43 & 0xffffffff;
                bVar26 = true;
                uVar16 = 0;
LAB_0068a8bf:
                pSVar44 = p->ppCuts[uVar43];
                uVar22 = *(uint *)&pSVar44->field_0x14 >> 0x1c;
                do {
                  pSVar5 = p->ppCuts[uVar16];
                  uVar23 = *(uint *)&pSVar5->field_0x14 >> 0x1c;
                  if ((uVar22 < uVar23) && ((pSVar44->Sign & ~pSVar5->Sign) == 0)) {
                    if (*(uint *)&pSVar44->field_0x14 < 0x10000000) goto LAB_0068a92b;
                    uVar37 = 0;
                    uVar27 = 0;
                    do {
                      if (pSVar44->pLeaves[(int)uVar27] < pSVar5->pLeaves[uVar37]) break;
                      if ((pSVar5->pLeaves[uVar37] == pSVar44->pLeaves[(int)uVar27]) &&
                         (uVar27 = uVar27 + 1, uVar27 == uVar22)) goto LAB_0068a92b;
                      uVar37 = uVar37 + 1;
                    } while (uVar23 != uVar37);
                  }
                  uVar16 = uVar16 + 1;
                  if (uVar16 == uVar43) {
                    if (bVar26) goto LAB_0068a9bd;
                    goto LAB_0068a970;
                  }
                } while( true );
              }
              goto LAB_0068adeb;
            }
            uVar43 = 1;
          }
          else {
            iVar13 = 0;
            uVar35 = 0;
            if (uVar15 < 0x10000000) {
LAB_00689dd7:
              if ((int)(uVar35 + uVar23) <= (int)(iVar13 + uVar22)) {
                if (iVar13 < (int)uVar23) {
                  lVar38 = 0;
                  do {
                    pSVar44->pLeaves[(int)uVar35 + lVar38] = piVar36[iVar13 + lVar38];
                    lVar38 = lVar38 + 1;
                  } while ((ulong)uVar23 - (long)iVar13 != lVar38);
LAB_00689e72:
                  uVar35 = uVar35 + (int)lVar38;
                }
                goto LAB_00689e7e;
              }
            }
            else {
              iVar12 = 0;
              uVar35 = 0;
              if (*(uint *)&pSVar28->field_0x14 < 0x10000000) {
LAB_00689e32:
                if ((int)(uVar35 + uVar27) <= (int)(iVar12 + uVar22)) {
                  if (iVar12 < (int)uVar27) {
                    lVar38 = 0;
                    do {
                      pSVar44->pLeaves[(int)uVar35 + lVar38] = piVar33[iVar12 + lVar38];
                      lVar38 = lVar38 + 1;
                    } while ((ulong)uVar27 - (long)iVar12 != lVar38);
                    goto LAB_00689e72;
                  }
                  goto LAB_00689e7e;
                }
              }
              else if (uVar22 != 0) {
                uVar16 = 0;
                iVar12 = 0;
                iVar34 = 0;
                do {
                  iVar13 = pSVar18->pLeaves[iVar12];
                  iVar1 = pSVar28->pLeaves[iVar34];
                  if (iVar13 < iVar1) {
                    iVar12 = iVar12 + 1;
                    pSVar44->pLeaves[uVar16] = iVar13;
                    iVar13 = iVar34;
                    if ((int)uVar27 <= iVar12) {
LAB_0068a66f:
                      uVar35 = (int)uVar16 + 1;
                      goto LAB_00689dd7;
                    }
                  }
                  else {
                    if (iVar1 < iVar13) {
                      pSVar44->pLeaves[uVar16] = iVar1;
                    }
                    else {
                      iVar12 = iVar12 + 1;
                      pSVar44->pLeaves[uVar16] = iVar13;
                      iVar13 = iVar34 + 1;
                      if ((int)uVar27 <= iVar12) goto LAB_0068a66f;
                    }
                    iVar34 = iVar34 + 1;
                    if ((int)uVar23 <= iVar34) {
                      uVar35 = (int)uVar16 + 1;
                      goto LAB_00689e32;
                    }
                  }
                  uVar16 = uVar16 + 1;
                } while (uVar17 != uVar16);
              }
            }
          }
        }
        goto LAB_0068aa42;
      }
LAB_0068aa63:
      uVar15 = (int)local_40 + 1;
      uVar16 = (ulong)uVar15;
      pSVar18 = pSVar18 + 1;
      piVar33 = piVar33 + 0xc;
      uVar22 = local_9c;
    } while (uVar15 != local_a4);
  }
  uVar10 = (uint)uVar43;
  p->CutCount[3] = (double)(int)uVar10 + p->CutCount[3];
  p->nCutsOver = p->nCutsOver + (uint)(uVar10 == uVar22);
  p->nCutsR = uVar10;
  p->Pivot = local_bc;
  if (((int)uVar10 < 1) || ((int)local_80 <= (int)uVar10)) {
    __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                  ,0x305,"void Sdb_StoMergeCuts(Sdb_Sto_t *, int)");
  }
  uVar17 = 0;
  do {
    pSVar18 = p->ppCuts[uVar17];
    uVar22 = *(uint *)&pSVar18->field_0x14;
    if (0x6fffffff < uVar22) {
      __assert_fail("pCut0->nLeaves <= SDB_MAX_CUTSIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                    ,0x16d,"int Sdb_CutSetCheckArray(Sdb_Cut_t **, int)");
    }
    if (uVar22 < 0x10000000) {
      uVar16 = 0;
      if (pSVar18->Sign != 0) {
LAB_0068ae86:
        __assert_fail("pCut0->Sign == Sdb_CutGetSign(pCut0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                      ,0x16e,"int Sdb_CutSetCheckArray(Sdb_Cut_t **, int)");
      }
    }
    else {
      uVar16 = (ulong)(uVar22 >> 0x1c);
      uVar39 = 0;
      uVar37 = 0;
      do {
        uVar37 = uVar37 | 1L << ((ulong)(byte)pSVar18->pLeaves[uVar39] & 0x3f);
        uVar39 = uVar39 + 1;
      } while (uVar16 != uVar39);
      if (pSVar18->Sign != uVar37) goto LAB_0068ae86;
      piVar33 = pSVar18->pLeaves;
      uVar39 = 0;
      uVar37 = uVar16;
      do {
        piVar33 = piVar33 + 1;
        uVar37 = uVar37 - 1;
        uVar42 = uVar39 + 1;
        if (uVar42 < uVar16) {
          uVar41 = 0;
          do {
            if (piVar33[uVar41] <= pSVar18->pLeaves[uVar39]) {
              __assert_fail("pCut0->pLeaves[m] < pCut0->pLeaves[n]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                            ,0x172,"int Sdb_CutSetCheckArray(Sdb_Cut_t **, int)");
            }
            uVar41 = uVar41 + 1;
          } while (uVar37 != uVar41);
        }
        uVar39 = uVar42;
      } while (uVar42 != uVar16);
    }
    uVar37 = 0;
    do {
      pSVar28 = p->ppCuts[uVar37];
      if (pSVar18 != pSVar28) {
        if (*(uint *)&pSVar28->field_0x14 < 0x10000000) {
LAB_0068ad50:
          __assert_fail("Value == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                        ,0x17b,"int Sdb_CutSetCheckArray(Sdb_Cut_t **, int)");
        }
        uVar39 = 0;
        while( true ) {
          uVar42 = 0;
          if (0xfffffff < uVar22) {
            uVar42 = 0;
            while (pSVar28->pLeaves[uVar39] != pSVar18->pLeaves[uVar42]) {
              uVar42 = uVar42 + 1;
              if (uVar16 == uVar42) goto LAB_0068abd1;
            }
          }
          if ((int)uVar42 == (int)uVar16) break;
          uVar39 = uVar39 + 1;
          if (uVar39 == *(uint *)&pSVar28->field_0x14 >> 0x1c) goto LAB_0068ad50;
        }
      }
LAB_0068abd1:
      uVar37 = uVar37 + 1;
    } while (uVar37 != uVar43);
    uVar17 = uVar17 + 1;
  } while (uVar17 != uVar43);
  if (local_bc < p->vCuts->nSize) {
    pVVar29 = p->vCuts->pArray + local_78;
    local_78 = local_78 * 0x10;
    Vec_IntPush(pVVar29,uVar10);
    uVar17 = 0;
    do {
      Vec_IntPush(pVVar29,*(uint *)&p->ppCuts[uVar17]->field_0x14 >> 0x1c);
      pSVar18 = p->ppCuts[uVar17];
      if (0xfffffff < *(uint *)&pSVar18->field_0x14) {
        uVar16 = 0;
        do {
          Vec_IntPush(pVVar29,pSVar18->pLeaves[uVar16]);
          uVar16 = uVar16 + 1;
          pSVar18 = p->ppCuts[uVar17];
        } while (uVar16 < *(uint *)&pSVar18->field_0x14 >> 0x1c);
      }
      Vec_IntPush(pVVar29,pSVar18->iFunc);
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar43);
    if ((uVar10 != 1) || (0x1fffffff < *(uint *)&p->ppCuts[0]->field_0x14)) {
      if (p->vCuts->nSize <= local_bc) goto LAB_0068afdb;
      pVVar8 = p->vCuts->pArray;
      pVVar29 = (Vec_Int_t *)((long)&pVVar8->nCap + local_78);
      iVar11 = *(int *)((long)&pVVar8->nSize + local_78);
      if (iVar11 == 0) {
        Vec_IntPush(pVVar29,1);
      }
      else {
        if (iVar11 < 1) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
        }
        *pVVar29->pArray = *pVVar29->pArray + 1;
      }
      Vec_IntPush(pVVar29,1);
      Vec_IntPush(pVVar29,local_bc);
      Vec_IntPush(pVVar29,2);
    }
    return;
  }
LAB_0068afdb:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
LAB_0068a92b:
  *(uint *)&pSVar5->field_0x14 = *(uint *)&pSVar5->field_0x14 | 0xf0000000;
  uVar16 = uVar16 + 1;
  bVar26 = false;
  if (uVar16 == uVar43) goto LAB_0068a970;
  goto LAB_0068a8bf;
LAB_0068a970:
  uVar43 = 0;
  iVar13 = 0;
  do {
    if (*(uint *)&p->ppCuts[uVar43]->field_0x14 < 0xf0000000) {
      lVar24 = (long)iVar13;
      if (lVar24 < (long)uVar43) {
        pSVar44 = p->ppCuts[lVar24];
        p->ppCuts[lVar24] = p->ppCuts[uVar43];
        p->ppCuts[uVar43] = pSVar44;
      }
      iVar13 = iVar13 + 1;
    }
    uVar43 = uVar43 + 1;
  } while (uVar15 + 1 != uVar43);
  uVar15 = iVar13 - 1;
LAB_0068a9bd:
  if ((int)uVar15 < 0) {
LAB_0068adeb:
    __assert_fail("nCuts >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/acec/acec2Mult.c"
                  ,0x238,"int Sdb_CutSetAddCut(Sdb_Cut_t **, int, int)");
  }
  uVar22 = uVar15;
  if (uVar15 != 0) {
    do {
      pSVar44 = p->ppCuts[(ulong)uVar22 - 1];
      uVar23 = *(uint *)&pSVar44->field_0x14;
      uVar27 = *(uint *)&p->ppCuts[uVar22]->field_0x14;
      uVar35 = uVar23 & 0xfffffff;
      uVar30 = uVar27 & 0xfffffff;
      if ((uVar35 < uVar30) || ((uVar35 <= uVar30 && (uVar23 >> 0x1c < uVar27 >> 0x1c)))) break;
      p->ppCuts[(ulong)uVar22 - 1] = p->ppCuts[uVar22];
      p->ppCuts[uVar22] = pSVar44;
      bVar26 = 1 < (int)uVar22;
      uVar22 = uVar22 - 1;
    } while (bVar26);
  }
  uVar43 = (ulong)(uVar15 + 1);
  if ((int)local_9c <= (int)(uVar15 + 1)) {
    uVar43 = (ulong)local_9c;
  }
LAB_0068aa42:
  iVar14 = iVar14 + 1;
  pSVar28 = pSVar28 + 1;
  piVar36 = piVar36 + 0xc;
  if (iVar14 == iVar11) goto LAB_0068aa63;
  goto LAB_00689cc7;
}

Assistant:

void Sdb_StoMergeCuts( Sdb_Sto_t * p, int iObj )
{
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    int fIsXor       = Gia_ObjIsXor(pObj);
    int nCutSize     = p->nCutSize;
    int nCutNum      = p->nCutNum;
    int fComp0       = Gia_ObjFaninC0(pObj);
    int fComp1       = Gia_ObjFaninC1(pObj);
    int Fan0         = Gia_ObjFaninId0(pObj, iObj);
    int Fan1         = Gia_ObjFaninId1(pObj, iObj);
    int nCuts0       = Sdb_StoPrepareSet( p, Fan0, 0 );
    int nCuts1       = Sdb_StoPrepareSet( p, Fan1, 1 );
    int i, k, nCutsR = 0;
    Sdb_Cut_t * pCut0, * pCut1, ** pCutsR = p->ppCuts;
    assert( !Gia_ObjIsBuf(pObj) );
    assert( !Gia_ObjIsMux(p->pGia, pObj) );
    Sdb_StoInitResult( p );
    p->CutCount[0] += nCuts0 * nCuts1;
    for ( i = 0, pCut0 = p->pCuts[0]; i < nCuts0; i++, pCut0++ )
    for ( k = 0, pCut1 = p->pCuts[1]; k < nCuts1; k++, pCut1++ )
    {
        if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nCutSize && Sdb_CutCountBits(pCut0->Sign | pCut1->Sign) > nCutSize )
            continue;
        p->CutCount[1]++; 
        if ( !Sdb_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nCutSize) )
            continue;
        if ( Sdb_CutSetLastCutIsContained(pCutsR, nCutsR) )
            continue;
        p->CutCount[2]++;
        if ( p->fCutMin && Sdb_CutComputeTruth(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
            pCutsR[nCutsR]->Sign = Sdb_CutGetSign(pCutsR[nCutsR]);
        pCutsR[nCutsR]->nTreeLeaves = Sdb_CutTreeLeaves( p, pCutsR[nCutsR] );
        nCutsR = Sdb_CutSetAddCut( pCutsR, nCutsR, nCutNum );
    }
    p->CutCount[3] += nCutsR;
    p->nCutsOver += nCutsR == nCutNum-1;
    p->nCutsR = nCutsR;
    p->Pivot = iObj;
    // debug printout
    if ( 0 )
    {
        printf( "*** Obj = %4d  NumCuts = %4d\n", iObj, nCutsR );
        for ( i = 0; i < nCutsR; i++ )
            Sdb_CutPrint( p, iObj, pCutsR[i] );
        printf( "\n" );
    }
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
    assert( Sdb_CutSetCheckArray(pCutsR, nCutsR) );
    // store the cutset
    Sdb_StoStoreResult( p, iObj, pCutsR, nCutsR );
    if ( nCutsR > 1 || pCutsR[0]->nLeaves > 1 )
        Sdb_CutAddUnit( p, iObj );
}